

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O0

int SDL_PollEvent(SDL12_Event *event12)

{
  int retval;
  SDL12_Event *event12_local;
  
  if (EventQueueMutex == (SDL_mutex *)0x0) {
    event12_local._4_4_ = 0;
  }
  else {
    (*SDL20_LockMutex)(EventQueueMutex);
    event12_local._4_4_ = SDL_PollEvent_locked(event12);
    (*SDL20_UnlockMutex)(EventQueueMutex);
  }
  return event12_local._4_4_;
}

Assistant:

SDLCALL
SDL_PollEvent(SDL12_Event *event12)
{
    int retval;

    if (!EventQueueMutex) {
        return 0;
    }

    SDL20_LockMutex(EventQueueMutex);
    retval = SDL_PollEvent_locked(event12);
    SDL20_UnlockMutex(EventQueueMutex);

    return retval;
}